

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:38:21)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>
          *this,string *arg)

{
  string *in_RCX;
  string *arg_local;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>
  *this_local;
  
  invokeLambda<std::__cxx11::string,main::__0>
            (__return_storage_ptr__,(Detail *)&this->field_0x8,
             (anon_class_1_0_00000001_for_m_lambda *)arg,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }